

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjLookupTable::make_list
          (CVmObjLookupTable *this,vm_val_t *retval,int store_keys,
          _func_int_vm_val_t_ptr_vm_val_t_ptr *filter)

{
  vm_obj_id_t obj;
  int iVar1;
  vm_lookup_ext *pvVar2;
  code *in_RCX;
  int in_EDX;
  vm_val_t *in_RSI;
  CVmObjLookupTable *in_RDI;
  CVmObjList *lst;
  int cnt;
  uint i;
  vm_lookup_val *entry;
  uint local_2c;
  vm_lookup_val *local_28;
  
  local_2c = get_entry_count((CVmObjLookupTable *)0x31644e);
  pvVar2 = get_ext(in_RDI);
  local_28 = vm_lookup_ext::idx_to_val(pvVar2,0);
  for (; local_2c != 0; local_2c = local_2c - 1) {
    if (((local_28->key).typ != VM_EMPTY) && (in_RCX != (code *)0x0)) {
      (*in_RCX)(local_28,&local_28->val);
    }
    local_28 = local_28 + 1;
  }
  obj = CVmObjList::create((int)((ulong)in_RDI >> 0x20),(size_t)in_RSI);
  vm_val_t::set_obj(in_RSI,obj);
  vm_objp(0);
  CVmObjList::cons_clear((CVmObjList *)in_RDI);
  local_2c = get_entry_count((CVmObjLookupTable *)0x316516);
  pvVar2 = get_ext(in_RDI);
  local_28 = vm_lookup_ext::idx_to_val(pvVar2,0);
  for (; local_2c != 0; local_2c = local_2c - 1) {
    if (((local_28->key).typ != VM_EMPTY) &&
       ((in_RCX == (code *)0x0 || (iVar1 = (*in_RCX)(local_28,&local_28->val), iVar1 != 0)))) {
      if (in_EDX == 0) {
        CVmObjList::cons_set_element((CVmObjList *)in_RDI,(size_t)in_RSI,(vm_val_t *)0x3165a1);
      }
      else {
        CVmObjList::cons_set_element((CVmObjList *)in_RDI,(size_t)in_RSI,(vm_val_t *)0x316587);
      }
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CVmObjLookupTable::make_list(VMG_ vm_val_t *retval, int store_keys,
                                  int (*filter)(VMG_ const vm_val_t *,
                                                const vm_val_t *))
{
    vm_lookup_val *entry;
    uint i;
    int cnt;
    CVmObjList *lst;

    /* run through the table and count in-use entries */
    for (cnt = 0, i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* skip empties */
        if (entry->key.typ == VM_EMPTY)
            continue;

        /* skip values that the filter function rejects */
        if (filter != 0 && !filter(vmg_ &entry->key, &entry->val))
            continue;

        /* count it */
        ++cnt;
    }

    /* allocate a list to store the results */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));

    /* get the list object */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    lst->cons_clear();

    /* populate the list */
    for (cnt = 0, i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* if the entry is not marked as free, count it as used */
        if (entry->key.typ != VM_EMPTY)
        {
            /* skip values that the filter function rejects */
            if (filter != 0 && !filter(vmg_ &entry->key, &entry->val))
                continue;

            /* store the key or value, as appropriate */
            if (store_keys)
            {
                /* store the key */
                lst->cons_set_element(cnt, &entry->key);
            }
            else
            {
                /* store the value */
                lst->cons_set_element(cnt, &entry->val);
            }

            /* update the destination index */
            ++cnt;
        }
    }
}